

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  uint uVar2;
  Wal *pWal;
  u32 *puVar3;
  _func_int_sqlite3_file_ptr *p_Var4;
  bool bVar5;
  Pager *pPVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint *p;
  uint uVar13;
  uint uVar14;
  PgHdr **ppPVar15;
  long lVar16;
  Pgno nTruncate_00;
  ulong uVar17;
  long lVar18;
  PgHdr *pPVar19;
  long lVar20;
  u32 uVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  WalWriter w;
  u8 aFrame [24];
  int local_d8;
  ulong local_c0;
  PgHdr *local_a8;
  PgHdr *local_a0;
  WalWriter local_98;
  PgHdr *local_70;
  long local_68;
  sqlite3_file *local_60;
  uint *local_58;
  Pager *local_50;
  u32 local_48 [6];
  
  local_a0 = pList;
  if (isCommit == 0) {
    iVar8 = 1;
  }
  else {
    iVar8 = 0;
    if (pList != (PgHdr *)0x0) {
      ppPVar15 = &local_a0;
      do {
        if (pList->pgno <= nTruncate) {
          ppPVar15 = &pList->pDirty;
        }
        iVar8 = iVar8 + (uint)(pList->pgno <= nTruncate);
        pList = pList->pDirty;
        *ppPVar15 = pList;
      } while (pList != (PgHdr *)0x0);
    }
  }
  pPager->aStat[2] = pPager->aStat[2] + iVar8;
  if (local_a0->pgno == 1) {
    uVar13 = *(uint *)local_a0->pPager->dbFileVers;
    uVar13 = (uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18) +
             1;
    uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 * 0x1000000
    ;
    *(uint *)((long)local_a0->pData + 0x18) = uVar13;
    *(uint *)((long)local_a0->pData + 0x5c) = uVar13;
    *(undefined4 *)((long)local_a0->pData + 0x60) = 0x28092e00;
  }
  local_70 = local_a0;
  pWal = pPager->pWal;
  uVar13 = pPager->pageSize;
  bVar1 = pPager->walSyncFlags;
  uVar9 = (uint)bVar1;
  puVar3 = *pWal->apWiData;
  local_50 = pPager;
  iVar10 = bcmp(&pWal->hdr,puVar3,0x30);
  iVar8 = 0;
  uVar11 = 0;
  if (iVar10 != 0) {
    uVar11 = puVar3[4] + 1;
  }
  if (pWal->readLock == 0) {
    if (puVar3[0x18] != 0) {
      sqlite3_randomness(4,&local_98);
      iVar8 = 0;
      if (pWal->exclusiveMode == '\0') {
        iVar8 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
      }
      if (iVar8 != 5) {
        if (iVar8 != 0) goto LAB_001215a5;
        walRestartHdr(pWal,(u32)local_98.pWal);
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
        }
      }
    }
    if (pWal->exclusiveMode == '\0') {
      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,5);
    }
    pWal->readLock = -1;
    iVar10 = 1;
    do {
      iVar8 = walTryBeginRead(pWal,(int *)&local_98,1,iVar10);
      iVar10 = iVar10 + 1;
    } while (iVar8 == -1);
  }
LAB_001215a5:
  if (iVar8 != 0) goto LAB_001215aa;
  uVar2 = (pWal->hdr).mxFrame;
  local_c0 = (ulong)uVar2;
  if (local_c0 == 0) {
    local_98.pWal = (Wal *)0x18e22d0082067f37;
    uVar12 = pWal->nCkpt;
    local_98.pFd = (sqlite3_file *)
                   CONCAT44(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                            uVar12 << 0x18,
                            uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                            uVar13 << 0x18);
    if (uVar12 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_98.iSyncPoint = *(long *)(pWal->hdr).aSalt;
    uVar12 = 0;
    uVar17 = 0xfffffffffffffff8;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + uVar12 + *(int *)((long)&local_98.pFd + uVar17);
      uVar12 = uVar12 + *(int *)((long)&local_98.pFd + uVar17 + 4) + uVar14;
      uVar17 = uVar17 + 8;
    } while (uVar17 < 0x10);
    local_98.syncFlags =
         uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 * 0x1000000;
    local_98.szPage =
         uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 * 0x1000000;
    pWal->szPage = uVar13;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = uVar14;
    (pWal->hdr).aFrameCksum[1] = uVar12;
    pWal->truncateOnCommit = '\x01';
    iVar10 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_98,0x20,0);
    if ((iVar10 == 0) &&
       (((uVar9 == 0 || (pWal->syncHeader == '\0')) ||
        (iVar10 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar9 & 0x13), iVar10 == 0)))) {
      iVar10 = 0;
      bVar24 = true;
    }
    else {
      iVar8 = iVar10;
      bVar24 = false;
      iVar10 = iVar8;
    }
    local_d8 = iVar8;
    if (!bVar24) goto LAB_001215aa;
  }
  else {
    iVar10 = 0;
  }
  local_98.pFd = pWal->pWalFd;
  local_98.iSyncPoint = 0;
  lVar18 = (long)(int)(uVar13 + 0x18);
  lVar16 = local_c0 * lVar18 + 0x20;
  local_a8 = (PgHdr *)0x0;
  local_98.pWal = pWal;
  local_98.szPage = uVar13;
  local_98.syncFlags = uVar9;
  local_60 = local_98.pFd;
  iVar23 = local_d8;
  for (pPVar19 = local_70; pPVar19 != (PgHdr *)0x0; pPVar19 = pPVar19->pDirty) {
    local_d8 = iVar23;
    if ((uVar11 == 0) || ((isCommit != 0 && (pPVar19->pDirty == (PgHdr *)0x0)))) {
LAB_00121822:
      if (isCommit == 0) {
        nTruncate_00 = 0;
      }
      else {
        nTruncate_00 = 0;
        if (pPVar19->pDirty == (PgHdr *)0x0) {
          nTruncate_00 = nTruncate;
        }
      }
      local_c0 = (ulong)((int)local_c0 + 1);
      iVar10 = walWriteOneFrame(&local_98,pPVar19,nTruncate_00,lVar16);
      bVar24 = iVar10 == 0;
      iVar8 = iVar10;
      if (bVar24) {
        *(byte *)&pPVar19->flags = (byte)pPVar19->flags | 0x40;
        lVar16 = lVar16 + lVar18;
        iVar10 = 0;
        iVar8 = local_d8;
        local_a8 = pPVar19;
      }
      local_d8 = iVar8;
      bVar24 = !bVar24;
    }
    else {
      local_48[0] = 0;
      sqlite3WalFindFrame(pWal,pPVar19->pgno,local_48);
      uVar21 = local_48[0];
      bVar24 = false;
      if (uVar11 <= local_48[0]) {
        if (local_48[0] <= pWal->iReCksum - 1) {
          pWal->iReCksum = local_48[0];
        }
        iVar10 = (*pWal->pWalFd->pMethods->xWrite)
                           (pWal->pWalFd,pPVar19->pData,uVar13,
                            (ulong)(local_48[0] - 1) * lVar18 + 0x38);
        bVar24 = true;
        local_d8 = iVar10;
        if (iVar10 == 0) {
          *(byte *)&pPVar19->flags = (byte)pPVar19->flags & 0xbf;
          bVar24 = false;
          local_d8 = iVar23;
        }
      }
      if (uVar21 < uVar11) goto LAB_00121822;
    }
    iVar8 = local_d8;
    if (bVar24) goto LAB_001215aa;
    uVar2 = (uint)local_c0;
    iVar23 = local_d8;
  }
  if ((isCommit != 0) && (pWal->iReCksum != 0)) {
    lVar20 = (long)(int)pWal->szPage + 0x18;
    iVar10 = (int)lVar20;
    local_68 = lVar16;
    p = (uint *)sqlite3_malloc(iVar10);
    if (p == (uint *)0x0) {
      iVar8 = 7;
    }
    else {
      lVar16 = 0x18;
      if (pWal->iReCksum != 1) {
        lVar16 = (ulong)(pWal->iReCksum - 2) * lVar20 + 0x30;
      }
      iVar8 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,lVar16);
      uVar11 = *p;
      (pWal->hdr).aFrameCksum[0] =
           uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      uVar11 = p[1];
      (pWal->hdr).aFrameCksum[1] =
           uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      uVar11 = pWal->iReCksum;
      pWal->iReCksum = 0;
      if (uVar11 <= uVar2 && iVar8 == 0) {
        local_58 = p + 6;
        do {
          lVar16 = (ulong)(uVar11 - 1) * (long)iVar10 + 0x20;
          iVar8 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar10,lVar16);
          if (iVar8 == 0) {
            uVar12 = *p;
            uVar14 = p[1];
            walEncodeFrame(pWal,uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                                uVar12 << 0x18,
                           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                           uVar14 << 0x18,(u8 *)local_58,(u8 *)local_48);
            iVar8 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,local_48,0x18,lVar16);
          }
        } while ((uVar11 + 1 <= uVar2) && (uVar11 = uVar11 + 1, iVar8 == 0));
      }
      sqlite3_free(p);
    }
    if (iVar8 != 0) goto LAB_001215aa;
    iVar10 = 0;
    lVar16 = local_68;
  }
  iVar22 = 0;
  if ((bVar1 & 0x20) != 0 && isCommit != 0) {
    if (pWal->padToSectorBoundary == '\0') {
      bVar24 = true;
      iVar22 = 0;
LAB_00121b1a:
      bVar5 = true;
      if (bVar24) {
        iVar10 = (*local_60->pMethods->xSync)(local_60,uVar9 & 0x13);
      }
    }
    else {
      p_Var4 = pWal->pWalFd->pMethods->xSectorSize;
      if (p_Var4 == (_func_int_sqlite3_file_ptr *)0x0) {
        uVar11 = 0x1000;
      }
      else {
        uVar11 = (*p_Var4)(pWal->pWalFd);
      }
      uVar12 = 0x10000;
      if ((int)uVar11 < 0x10000) {
        uVar12 = uVar11;
      }
      uVar14 = 0x200;
      if (0x1f < (int)uVar11) {
        uVar14 = uVar12;
      }
      lVar20 = lVar16 + (ulong)uVar14 + -1;
      lVar20 = lVar20 - lVar20 % (long)(ulong)uVar14;
      iVar22 = 0;
      bVar24 = lVar20 == lVar16;
      bVar5 = !bVar24 && lVar16 <= lVar20;
      iVar8 = iVar23;
      local_98.iSyncPoint = lVar20;
      if ((lVar16 < lVar20) &&
         (iVar10 = walWriteOneFrame(&local_98,local_a8,nTruncate,lVar16), iVar8 = iVar10,
         iVar10 == 0)) {
        iVar7 = 1;
        do {
          iVar22 = iVar7;
          lVar16 = lVar16 + lVar18;
          bVar5 = lVar16 < lVar20;
          if (lVar20 <= lVar16) {
            iVar10 = 0;
            iVar8 = iVar23;
            break;
          }
          iVar10 = walWriteOneFrame(&local_98,local_a8,nTruncate,lVar16);
          iVar8 = iVar10;
          iVar7 = iVar22 + 1;
        } while (iVar10 == 0);
      }
      iVar23 = iVar8;
      if (!bVar5) goto LAB_00121b1a;
      bVar5 = false;
    }
    iVar8 = iVar23;
    if (!bVar5) goto LAB_001215aa;
  }
  if (((isCommit != 0) && (pWal->truncateOnCommit != '\0')) &&
     (lVar16 = pWal->mxWalSize, -1 < lVar16)) {
    lVar18 = (ulong)(uVar2 + iVar22) * lVar18 + 0x20;
    if (lVar18 <= lVar16) {
      lVar18 = lVar16;
    }
    walLimitSize(pWal,lVar18);
    pWal->truncateOnCommit = '\0';
  }
  uVar21 = (pWal->hdr).mxFrame;
  pPVar19 = local_70;
  while ((pPVar19 != (PgHdr *)0x0 && (iVar10 == 0))) {
    iVar10 = 0;
    if ((pPVar19->flags & 0x40) != 0) {
      uVar21 = uVar21 + 1;
      iVar10 = walIndexAppend(pWal,uVar21,pPVar19->pgno);
    }
    pPVar19 = pPVar19->pDirty;
  }
  bVar24 = iVar10 == 0;
  if ((bVar24) && (0 < iVar22)) {
    do {
      uVar21 = uVar21 + 1;
      iVar10 = walIndexAppend(pWal,uVar21,local_a8->pgno);
      bVar24 = iVar10 == 0;
      if (!bVar24) break;
      bVar5 = 1 < iVar22;
      iVar22 = iVar22 + -1;
    } while (bVar5);
  }
  iVar8 = iVar10;
  if (bVar24) {
    (pWal->hdr).szPage = (ushort)(uVar13 >> 0x10) | (ushort)uVar13 & 0xff00;
    (pWal->hdr).mxFrame = uVar21;
    if (isCommit != 0) {
      puVar3 = &(pWal->hdr).iChange;
      *puVar3 = *puVar3 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = uVar21;
    }
  }
LAB_001215aa:
  pPVar6 = local_50;
  if ((iVar8 == 0) &&
     (pPVar19 = local_a0, local_a0 != (PgHdr *)0x0 && local_50->pBackup != (sqlite3_backup *)0x0)) {
    do {
      if (pPVar6->pBackup != (sqlite3_backup *)0x0) {
        backupUpdate(pPVar6->pBackup,pPVar19->pgno,(u8 *)pPVar19->pData);
      }
      pPVar19 = pPVar19->pDirty;
    } while (pPVar19 != (PgHdr *)0x0);
  }
  return iVar8;
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal, 
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}